

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::ReadAttribute
               (string *name,string *type,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *data,size_t *marker_size,
               char *marker,size_t size)

{
  int iVar1;
  size_t __new_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  reference pvVar2;
  long *in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  char *in_RSI;
  char *in_R8;
  size_t in_R9;
  uint32_t data_len;
  size_t type_len;
  size_t name_len;
  uint *puVar3;
  allocator *this_00;
  uint local_a8;
  allocator local_a1;
  string local_a0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator local_61;
  string local_60 [32];
  size_t local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  uint *local_30;
  long *local_28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_20;
  char *local_18;
  bool local_1;
  
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R9;
  local_30 = (uint *)in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  __new_size = strnlen(in_R8,in_R9);
  puVar3 = local_30;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__new_size == local_38) {
    local_1 = false;
  }
  else {
    this_00 = &local_61;
    local_40 = __new_size;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,(char *)puVar3,__new_size,this_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    local_30 = (uint *)((long)local_30 + local_40 + 1);
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)local_38 - (local_40 + 1));
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           strnlen((char *)local_30,(size_t)local_38);
    if (this == local_38) {
      local_1 = false;
    }
    else {
      puVar3 = local_30;
      this_01 = this;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,(char *)puVar3,(ulong)this,&local_a1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_01,in_stack_ffffffffffffff78);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      local_30 = (uint *)((undefined1 *)((long)&(this_01->_M_dataplus)._M_p + 1) + (long)local_30);
      local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)local_38 - (long)((long)&(this_01->_M_dataplus)._M_p + 1));
      if (local_38 < 4) {
        local_1 = false;
      }
      else {
        local_a8 = *local_30;
        swap4(&local_a8);
        if (local_a8 == 0) {
          iVar1 = std::__cxx11::string::compare(local_18);
          if (iVar1 == 0) {
            local_30 = local_30 + 1;
            local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)local_38 - 4);
            *local_28 = (long)&(this_01->_M_dataplus)._M_p + local_40 + 6;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,__new_size);
            pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (local_20,0);
            *pvVar2 = '\0';
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_30 = local_30 + 1;
          local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)local_38 - 4);
          if (local_38 < (ulong)local_a8) {
            local_1 = false;
          }
          else {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,__new_size);
            pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
                                (size_type)puVar3);
            memcpy(pvVar2,local_30,(ulong)local_a8);
            *local_28 = (long)&(this_01->_M_dataplus)._M_p + (ulong)local_a8 + local_40 + 6;
            local_1 = true;
          }
        }
      }
    }
  }
  return local_1;
}

Assistant:

static bool ReadAttribute(std::string *name, std::string *type,
                          std::vector<unsigned char> *data, size_t *marker_size,
                          const char *marker, size_t size) {
  size_t name_len = strnlen(marker, size);
  if (name_len == size) {
    // String does not have a terminating character.
    return false;
  }
  *name = std::string(marker, name_len);

  marker += name_len + 1;
  size -= name_len + 1;

  size_t type_len = strnlen(marker, size);
  if (type_len == size) {
    return false;
  }
  *type = std::string(marker, type_len);

  marker += type_len + 1;
  size -= type_len + 1;

  if (size < sizeof(uint32_t)) {
    return false;
  }

  uint32_t data_len;
  memcpy(&data_len, marker, sizeof(uint32_t));
  tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

  if (data_len == 0) {
    if ((*type).compare("string") == 0) {
      // Accept empty string attribute.

      marker += sizeof(uint32_t);
      size -= sizeof(uint32_t);

      *marker_size = name_len + 1 + type_len + 1 + sizeof(uint32_t);

      data->resize(1);
      (*data)[0] = '\0';

      return true;
    } else {
      return false;
    }
  }

  marker += sizeof(uint32_t);
  size -= sizeof(uint32_t);

  if (size < data_len) {
    return false;
  }

  data->resize(static_cast<size_t>(data_len));
  memcpy(&data->at(0), marker, static_cast<size_t>(data_len));

  *marker_size = name_len + 1 + type_len + 1 + sizeof(uint32_t) + data_len;
  return true;
}